

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_vb.c
# Opt level: O1

void saa_envgen_load(SAA_CHIP *saa,UINT8 genID)

{
  byte bVar1;
  ulong uVar2;
  undefined3 in_register_00000031;
  
  uVar2 = (ulong)CONCAT31(in_register_00000031,genID);
  bVar1 = saa->regs[uVar2 | 0x18];
  saa->env[uVar2].extClock = bVar1 >> 5 & 1;
  saa->env[uVar2].wave = bVar1 >> 1 & 7;
  saa->env[uVar2].invert = bVar1 & 1;
  saa->env[uVar2].pos = '\0';
  saa->env[uVar2].reload = '\0';
  if (saa->env[uVar2].enable != '\0') {
    return;
  }
  saa->env[uVar2].flags = 0xc0;
  saa->env[uVar2].volL = '\x10';
  saa->env[uVar2].volR = '\x10';
  return;
}

Assistant:

static void saa_envgen_load(SAA_CHIP* saa, UINT8 genID)
{
	SAA_ENV_GEN* saaEGen = &saa->env[genID];
	UINT8 data = saa->regs[0x18 | genID];
	
	saaEGen->extClock = (data >> 5) & 0x01;
	saaEGen->wave = (data >> 1) & 0x07;
	saaEGen->invert = (data >> 0) & 0x01;
	saaEGen->pos = 0x00;
	saaEGen->reload = 0;
	
	if (! saaEGen->enable)
	{
		saaEGen->flags = ENV_LOAD | ENV_STAY;
		saaEGen->volL = saaEGen->volR = 0x10;
	}
	
	return;
}